

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O3

void __thiscall
TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test::
TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test
          (TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).test1 = (UtestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).test2 = (UtestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry.runInSeperateProcess_ = false
  ;
  *(undefined3 *)&(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry.field_0x29 =
       0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry.currentRepetition_ = 0;
  *(undefined8 *)&(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry.runIgnored_ =
       0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry.groupFilters_ =
       (TestFilter *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry.firstPlugin_ =
       (TestPlugin *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry.tests_ = (UtestShell *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry.nameFilters_ =
       (TestFilter *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry._vptr_TestRegistry =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).pluginCountingPlugin =
       (DummyPluginWhichCountsThePlugins *)0x0;
  Utest::Utest((Utest *)this);
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupCommandLineTestRunner_00348400;
  TestRegistry::TestRegistry(&(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry);
  (this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupCommandLineTestRunner_00347ee8;
  return;
}

Assistant:

TEST(CommandLineTestRunner, testsCanBeRunInReverseOrder)
{
    const char* argv[] = { "tests.exe", "-v", "-b"};

    registry.addTest(test2);
    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(3, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    SimpleStringCollection stringCollection;
    commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().split("\n", stringCollection);
    STRCMP_CONTAINS("test1", stringCollection[0].asCharString());
    STRCMP_CONTAINS("test2", stringCollection[1].asCharString());
}